

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetBlendFactorLiteralName(BLEND_FACTOR BlendFactor)

{
  Char *Message;
  char (*in_R8) [2];
  int local_3c;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  BLEND_FACTOR BlendFactor_local;
  
  switch(BlendFactor) {
  case BLEND_FACTOR_UNDEFINED:
    pcStack_10 = "BLEND_FACTOR_UNDEFINED";
    break;
  case BLEND_FACTOR_ZERO:
    pcStack_10 = "BLEND_FACTOR_ZERO";
    break;
  case BLEND_FACTOR_ONE:
    pcStack_10 = "BLEND_FACTOR_ONE";
    break;
  case BLEND_FACTOR_SRC_COLOR:
    pcStack_10 = "BLEND_FACTOR_SRC_COLOR";
    break;
  case BLEND_FACTOR_INV_SRC_COLOR:
    pcStack_10 = "BLEND_FACTOR_INV_SRC_COLOR";
    break;
  case BLEND_FACTOR_SRC_ALPHA:
    pcStack_10 = "BLEND_FACTOR_SRC_ALPHA";
    break;
  case BLEND_FACTOR_INV_SRC_ALPHA:
    pcStack_10 = "BLEND_FACTOR_INV_SRC_ALPHA";
    break;
  case BLEND_FACTOR_DEST_ALPHA:
    pcStack_10 = "BLEND_FACTOR_DEST_ALPHA";
    break;
  case BLEND_FACTOR_INV_DEST_ALPHA:
    pcStack_10 = "BLEND_FACTOR_INV_DEST_ALPHA";
    break;
  case BLEND_FACTOR_DEST_COLOR:
    pcStack_10 = "BLEND_FACTOR_DEST_COLOR";
    break;
  case BLEND_FACTOR_INV_DEST_COLOR:
    pcStack_10 = "BLEND_FACTOR_INV_DEST_COLOR";
    break;
  case BLEND_FACTOR_SRC_ALPHA_SAT:
    pcStack_10 = "BLEND_FACTOR_SRC_ALPHA_SAT";
    break;
  case BLEND_FACTOR_BLEND_FACTOR:
    pcStack_10 = "BLEND_FACTOR_BLEND_FACTOR";
    break;
  case BLEND_FACTOR_INV_BLEND_FACTOR:
    pcStack_10 = "BLEND_FACTOR_INV_BLEND_FACTOR";
    break;
  case BLEND_FACTOR_SRC1_COLOR:
    pcStack_10 = "BLEND_FACTOR_SRC1_COLOR";
    break;
  case BLEND_FACTOR_INV_SRC1_COLOR:
    pcStack_10 = "BLEND_FACTOR_INV_SRC1_COLOR";
    break;
  case BLEND_FACTOR_SRC1_ALPHA:
    pcStack_10 = "BLEND_FACTOR_SRC1_ALPHA";
    break;
  case BLEND_FACTOR_INV_SRC1_ALPHA:
    pcStack_10 = "BLEND_FACTOR_INV_SRC1_ALPHA";
    break;
  default:
    local_3c = (int)(char)BlendFactor;
    msg.field_2._M_local_buf[0xf] = BlendFactor;
    FormatString<char[26],int,char[2]>
              ((string *)local_38,(Diligent *)"Unexpected blend factor (",(char (*) [26])&local_3c,
               (int *)0x46d916,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetBlendFactorLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x3ed);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const Char* GetBlendFactorLiteralName(BLEND_FACTOR BlendFactor)
{
#define BLEND_FACTOR_TO_STR(Factor) \
    case Factor: return #Factor

    static_assert(BLEND_FACTOR_NUM_FACTORS == 18, "Please update the switch below to handle the new blend factor");
    switch (BlendFactor)
    {
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_UNDEFINED);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_ZERO);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_ONE);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_SRC_COLOR);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_INV_SRC_COLOR);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_SRC_ALPHA);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_INV_SRC_ALPHA);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_DEST_ALPHA);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_INV_DEST_ALPHA);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_DEST_COLOR);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_INV_DEST_COLOR);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_SRC_ALPHA_SAT);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_BLEND_FACTOR);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_INV_BLEND_FACTOR);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_SRC1_COLOR);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_INV_SRC1_COLOR);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_SRC1_ALPHA);
        BLEND_FACTOR_TO_STR(BLEND_FACTOR_INV_SRC1_ALPHA);

        default:
            UNEXPECTED("Unexpected blend factor (", static_cast<int>(BlendFactor), ")");
            return "UNKNOWN";
    }
#undef BLEND_FACTOR_TO_STR
}